

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AssignEvaluator.h
# Opt level: O2

void Eigen::internal::
     call_dense_assignment_loop<Eigen::Map<Eigen::Matrix<double,_1,1,0,_1,1>,0,Eigen::Stride<0,0>>,Eigen::Product<Eigen::Block<Eigen::Block<Eigen::Matrix<double,_1,_1,0,_1,_1>,_1,_1,false>,_1,2,false>,Eigen::Matrix<double,2,1,0,2,1>,1>,Eigen::internal::assign_op<double,double>>
               (Map<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_0,_Eigen::Stride<0,_0>_> *dst,
               Product<Eigen::Block<Eigen::Block<Eigen::Matrix<double,__1,__1,_0,__1,__1>,__1,__1,_false>,__1,_2,_false>,_Eigen::Matrix<double,_2,_1,_0,_2,_1>,_1>
               *src,assign_op<double,_double> *func)

{
  long lVar1;
  Product<Eigen::Block<Eigen::Block<Eigen::Matrix<double,__1,__1,_0,__1,__1>,__1,__1,_false>,__1,_2,_false>,_Eigen::Matrix<double,_2,_1,_0,_2,_1>,_1>
  *pPVar2;
  variable_if_dynamic<long,__1> *pvVar3;
  DstEvaluatorType dstEvaluator;
  Kernel kernel;
  SrcEvaluatorType srcEvaluator;
  
  pPVar2 = src;
  pvVar3 = (variable_if_dynamic<long,__1> *)&srcEvaluator;
  for (lVar1 = 0xd; lVar1 != 0; lVar1 = lVar1 + -1) {
    pvVar3->m_value =
         (long)(pPVar2->m_lhs).
               super_BlockImpl<Eigen::Block<Eigen::Matrix<double,__1,__1,_0,__1,__1>,__1,__1,_false>,__1,_2,_false,_Eigen::Dense>
               .
               super_BlockImpl_dense<Eigen::Block<Eigen::Matrix<double,__1,__1,_0,__1,__1>,__1,__1,_false>,__1,_2,_false,_true>
               .
               super_MapBase<Eigen::Block<Eigen::Block<Eigen::Matrix<double,__1,__1,_0,__1,__1>,__1,__1,_false>,__1,_2,_false>,_1>
               .
               super_MapBase<Eigen::Block<Eigen::Block<Eigen::Matrix<double,__1,__1,_0,__1,__1>,__1,__1,_false>,__1,_2,_false>,_0>
               .m_data;
    pPVar2 = (Product<Eigen::Block<Eigen::Block<Eigen::Matrix<double,__1,__1,_0,__1,__1>,__1,__1,_false>,__1,_2,_false>,_Eigen::Matrix<double,_2,_1,_0,_2,_1>,_1>
              *)&(pPVar2->m_lhs).
                 super_BlockImpl<Eigen::Block<Eigen::Matrix<double,__1,__1,_0,__1,__1>,__1,__1,_false>,__1,_2,_false,_Eigen::Dense>
                 .
                 super_BlockImpl_dense<Eigen::Block<Eigen::Matrix<double,__1,__1,_0,__1,__1>,__1,__1,_false>,__1,_2,_false,_true>
                 .
                 super_MapBase<Eigen::Block<Eigen::Block<Eigen::Matrix<double,__1,__1,_0,__1,__1>,__1,__1,_false>,__1,_2,_false>,_1>
                 .
                 super_MapBase<Eigen::Block<Eigen::Block<Eigen::Matrix<double,__1,__1,_0,__1,__1>,__1,__1,_false>,__1,_2,_false>,_0>
                 .m_rows;
    pvVar3 = pvVar3 + 1;
  }
  srcEvaluator.
  super_product_evaluator<Eigen::Product<Eigen::Block<Eigen::Block<Eigen::Matrix<double,__1,__1,_0,__1,__1>,__1,__1,_false>,__1,_2,_false>,_Eigen::Matrix<double,_2,_1,_0,_2,_1>,_1>,_3,_Eigen::DenseShape,_Eigen::DenseShape,_double,_double>
  .m_rhs = src->m_rhs;
  srcEvaluator.
  super_product_evaluator<Eigen::Product<Eigen::Block<Eigen::Block<Eigen::Matrix<double,__1,__1,_0,__1,__1>,__1,__1,_false>,__1,_2,_false>,_Eigen::Matrix<double,_2,_1,_0,_2,_1>,_1>,_3,_Eigen::DenseShape,_Eigen::DenseShape,_double,_double>
  .m_lhsImpl.
  super_block_evaluator<Eigen::Block<Eigen::Matrix<double,__1,__1,_0,__1,__1>,__1,__1,_false>,__1,_2,_false,_true>
  .
  super_mapbase_evaluator<Eigen::Block<Eigen::Block<Eigen::Matrix<double,__1,__1,_0,__1,__1>,__1,__1,_false>,__1,_2,_false>,_Eigen::Matrix<double,__1,_2,_0,__1,_2>_>
  .m_data = srcEvaluator.
            super_product_evaluator<Eigen::Product<Eigen::Block<Eigen::Block<Eigen::Matrix<double,__1,__1,_0,__1,__1>,__1,__1,_false>,__1,_2,_false>,_Eigen::Matrix<double,_2,_1,_0,_2,_1>,_1>,_3,_Eigen::DenseShape,_Eigen::DenseShape,_double,_double>
            .m_lhs.
            super_BlockImpl<Eigen::Block<Eigen::Matrix<double,__1,__1,_0,__1,__1>,__1,__1,_false>,__1,_2,_false,_Eigen::Dense>
            .
            super_BlockImpl_dense<Eigen::Block<Eigen::Matrix<double,__1,__1,_0,__1,__1>,__1,__1,_false>,__1,_2,_false,_true>
            .
            super_MapBase<Eigen::Block<Eigen::Block<Eigen::Matrix<double,__1,__1,_0,__1,__1>,__1,__1,_false>,__1,_2,_false>,_1>
            .
            super_MapBase<Eigen::Block<Eigen::Block<Eigen::Matrix<double,__1,__1,_0,__1,__1>,__1,__1,_false>,__1,_2,_false>,_0>
            .m_data;
  srcEvaluator.
  super_product_evaluator<Eigen::Product<Eigen::Block<Eigen::Block<Eigen::Matrix<double,__1,__1,_0,__1,__1>,__1,__1,_false>,__1,_2,_false>,_Eigen::Matrix<double,_2,_1,_0,_2,_1>,_1>,_3,_Eigen::DenseShape,_Eigen::DenseShape,_double,_double>
  .m_lhsImpl.
  super_block_evaluator<Eigen::Block<Eigen::Matrix<double,__1,__1,_0,__1,__1>,__1,__1,_false>,__1,_2,_false,_true>
  .
  super_mapbase_evaluator<Eigen::Block<Eigen::Block<Eigen::Matrix<double,__1,__1,_0,__1,__1>,__1,__1,_false>,__1,_2,_false>,_Eigen::Matrix<double,__1,_2,_0,__1,_2>_>
  .m_outerStride.m_value =
       ((srcEvaluator.
         super_product_evaluator<Eigen::Product<Eigen::Block<Eigen::Block<Eigen::Matrix<double,__1,__1,_0,__1,__1>,__1,__1,_false>,__1,_2,_false>,_Eigen::Matrix<double,_2,_1,_0,_2,_1>,_1>,_3,_Eigen::DenseShape,_Eigen::DenseShape,_double,_double>
         .m_lhs.
         super_BlockImpl<Eigen::Block<Eigen::Matrix<double,__1,__1,_0,__1,__1>,__1,__1,_false>,__1,_2,_false,_Eigen::Dense>
         .
         super_BlockImpl_dense<Eigen::Block<Eigen::Matrix<double,__1,__1,_0,__1,__1>,__1,__1,_false>,__1,_2,_false,_true>
         .m_xpr.
         super_BlockImpl<Eigen::Matrix<double,__1,__1,_0,__1,__1>,__1,__1,_false,_Eigen::Dense>.
         super_BlockImpl_dense<Eigen::Matrix<double,__1,__1,_0,__1,__1>,__1,__1,_false,_true>.m_xpr)
       ->super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>).m_storage.m_rows;
  srcEvaluator.
  super_product_evaluator<Eigen::Product<Eigen::Block<Eigen::Block<Eigen::Matrix<double,__1,__1,_0,__1,__1>,__1,__1,_false>,__1,_2,_false>,_Eigen::Matrix<double,_2,_1,_0,_2,_1>,_1>,_3,_Eigen::DenseShape,_Eigen::DenseShape,_double,_double>
  .m_innerDim = 2;
  srcEvaluator.
  super_product_evaluator<Eigen::Product<Eigen::Block<Eigen::Block<Eigen::Matrix<double,__1,__1,_0,__1,__1>,__1,__1,_false>,__1,_2,_false>,_Eigen::Matrix<double,_2,_1,_0,_2,_1>,_1>,_3,_Eigen::DenseShape,_Eigen::DenseShape,_double,_double>
  .m_rhsImpl.super_evaluator<Eigen::PlainObjectBase<Eigen::Matrix<double,_2,_1,_0,_2,_1>_>_>.m_d.
  data = (evaluator<Eigen::PlainObjectBase<Eigen::Matrix<double,_2,_1,_0,_2,_1>_>_>)
         (evaluator<Eigen::PlainObjectBase<Eigen::Matrix<double,_2,_1,_0,_2,_1>_>_>)
         srcEvaluator.
         super_product_evaluator<Eigen::Product<Eigen::Block<Eigen::Block<Eigen::Matrix<double,__1,__1,_0,__1,__1>,__1,__1,_false>,__1,_2,_false>,_Eigen::Matrix<double,_2,_1,_0,_2,_1>,_1>,_3,_Eigen::DenseShape,_Eigen::DenseShape,_double,_double>
         .m_rhs;
  resize_if_allowed<Eigen::Map<Eigen::Matrix<double,_1,1,0,_1,1>,0,Eigen::Stride<0,0>>,Eigen::Product<Eigen::Block<Eigen::Block<Eigen::Matrix<double,_1,_1,0,_1,_1>,_1,_1,false>,_1,2,false>,Eigen::Matrix<double,2,1,0,2,1>,1>,double,double>
            (dst,src,func);
  dstEvaluator.
  super_mapbase_evaluator<Eigen::Map<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_0,_Eigen::Stride<0,_0>_>,_Eigen::Matrix<double,__1,_1,_0,__1,_1>_>
  .m_data = *(PointerType *)dst;
  dstEvaluator.
  super_mapbase_evaluator<Eigen::Map<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_0,_Eigen::Stride<0,_0>_>,_Eigen::Matrix<double,__1,_1,_0,__1,_1>_>
  .m_outerStride.m_value = *(long *)&dst->field_0x8;
  kernel.m_dst = &dstEvaluator;
  kernel.m_src = (SrcEvaluatorType *)&srcEvaluator;
  kernel.m_functor = func;
  kernel.m_dstExpr = dst;
  dense_assignment_loop<Eigen::internal::generic_dense_assignment_kernel<Eigen::internal::evaluator<Eigen::Map<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>,_0,_Eigen::Stride<0,_0>_>_>,_Eigen::internal::evaluator<Eigen::Product<Eigen::Block<Eigen::Block<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>,_-1,_-1,_false>,_-1,_2,_false>,_Eigen::Matrix<double,_2,_1,_0,_2,_1>,_1>_>,_Eigen::internal::assign_op<double,_double>,_0>,_3,_0>
  ::run(&kernel);
  return;
}

Assistant:

EIGEN_DEVICE_FUNC EIGEN_STRONG_INLINE void call_dense_assignment_loop(DstXprType& dst, const SrcXprType& src, const Functor &func)
{
  typedef evaluator<DstXprType> DstEvaluatorType;
  typedef evaluator<SrcXprType> SrcEvaluatorType;

  SrcEvaluatorType srcEvaluator(src);

  // NOTE To properly handle A = (A*A.transpose())/s with A rectangular,
  // we need to resize the destination after the source evaluator has been created.
  resize_if_allowed(dst, src, func);

  DstEvaluatorType dstEvaluator(dst);

  typedef generic_dense_assignment_kernel<DstEvaluatorType,SrcEvaluatorType,Functor> Kernel;
  Kernel kernel(dstEvaluator, srcEvaluator, func, dst.const_cast_derived());

  dense_assignment_loop<Kernel>::run(kernel);
}